

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O0

bool google::protobuf::compiler::csharp::IsDescriptorProto(FileDescriptor *descriptor)

{
  bool bVar1;
  bool local_51;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_30;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  FileDescriptor *local_10;
  FileDescriptor *descriptor_local;
  
  local_10 = descriptor;
  local_20 = FileDescriptor::name(descriptor);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,"google/protobuf/descriptor.proto");
  bVar1 = std::operator==(local_20,local_30);
  local_51 = true;
  if (!bVar1) {
    local_40 = FileDescriptor::name(local_10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,"net/proto2/proto/descriptor.proto");
    local_51 = std::operator==(local_40,local_50);
  }
  return local_51;
}

Assistant:

inline bool IsDescriptorProto(const FileDescriptor* descriptor) {
  return descriptor->name() == "google/protobuf/descriptor.proto" ||
         descriptor->name() == "net/proto2/proto/descriptor.proto";
}